

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any.h
# Opt level: O3

void UnitTests::stream_any_details::output_unsigned<unsigned_long>
               (ostream *s,unsigned_long *t,int width)

{
  long lVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>(s,"0x",2);
  lVar1 = *(long *)s;
  *(uint *)(s + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
  *(long *)(s + *(long *)(lVar1 + -0x18) + 0x10) = (long)width;
  *(uint *)(s + *(long *)(lVar1 + -0x18) + 0x18) =
       *(uint *)(s + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffff4f | 0x10;
  poVar2 = s + *(long *)(lVar1 + -0x18);
  if (s[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
  }
  poVar2[0xe0] = (ostream)0x30;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)s);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  return;
}

Assistant:

void output_unsigned(std::ostream& s, const T& t, int width)
        {
            s << "0x" << std::hex << std::setw(width) << std::internal << std::setfill('0') << t << std::dec;
        }